

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall
basisu::vector<unsigned_char>::erase(vector<unsigned_char> *this,uchar *pFirst,uchar *pEnd)

{
  bool bVar1;
  vector<unsigned_char> *pvVar2;
  uchar *puVar3;
  vector<unsigned_char> *in_RDX;
  vector<unsigned_char> *in_RSI;
  vector<unsigned_char> *in_RDI;
  int64_t n;
  int64_t ofs;
  vector<unsigned_char> *in_stack_ffffffffffffffb8;
  vector<unsigned_char> *this_00;
  
  if (in_RDX < in_RSI) {
    __assert_fail("pFirst <= pEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x318,"void basisu::vector<unsigned char>::erase(T *, T *) [T = unsigned char]");
  }
  this_00 = in_RSI;
  pvVar2 = (vector<unsigned_char> *)begin(in_RDI);
  bVar1 = false;
  if (pvVar2 <= this_00) {
    in_stack_ffffffffffffffb8 = in_RSI;
    pvVar2 = (vector<unsigned_char> *)end(in_RDI);
    bVar1 = in_stack_ffffffffffffffb8 <= pvVar2;
  }
  if (!bVar1) {
    __assert_fail("pFirst >= begin() && pFirst <= end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x319,"void basisu::vector<unsigned char>::erase(T *, T *) [T = unsigned char]");
  }
  pvVar2 = (vector<unsigned_char> *)begin(in_RDI);
  bVar1 = false;
  if (pvVar2 <= in_RDX) {
    pvVar2 = (vector<unsigned_char> *)end(in_RDI);
    bVar1 = in_RDX <= pvVar2;
  }
  if (!bVar1) {
    __assert_fail("pEnd >= begin() && pEnd <= end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x31a,"void basisu::vector<unsigned char>::erase(T *, T *) [T = unsigned char]");
  }
  puVar3 = begin(in_RDI);
  if (((long)in_RSI - (long)puVar3 < 0) || (0xffffffff < (long)in_RSI - (long)puVar3)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,799,"void basisu::vector<unsigned char>::erase(T *, T *) [T = unsigned char]");
  }
  if ((-1 < (long)in_RDX - (long)in_RSI) && ((long)in_RDX - (long)in_RSI < 0x100000000)) {
    erase(this_00,(uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
          (uint32_t)in_stack_ffffffffffffffb8);
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                ,0x326,"void basisu::vector<unsigned char>::erase(T *, T *) [T = unsigned char]");
}

Assistant:

inline void erase(T *pFirst, T *pEnd)
      {
         assert(pFirst <= pEnd);
         assert(pFirst >= begin() && pFirst <= end());
         assert(pEnd >= begin() && pEnd <= end());

         int64_t ofs = pFirst - begin();
         if ((ofs < 0) || (ofs > UINT32_MAX))
         {
            assert(0);
            return;
         }

         int64_t n = pEnd - pFirst;
         if ((n < 0) || (n > UINT32_MAX))
         {
            assert(0);
            return;
         }

         erase((uint32_t)ofs, (uint32_t)n);
      }